

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::X3DImporter::FindNodeElement_FromRoot
          (X3DImporter *this,string *pID,EType pType,CX3DImporter_NodeElement **pElement)

{
  pointer __s2;
  size_t sVar1;
  CX3DImporter_NodeElement *pCVar2;
  size_t __n;
  int iVar3;
  _List_node_base *p_Var4;
  bool bVar5;
  
  p_Var4 = (this->NodeElement_List).
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  bVar5 = p_Var4 != (_List_node_base *)&this->NodeElement_List;
  if (bVar5) {
    __s2 = (pID->_M_dataplus)._M_p;
    sVar1 = pID->_M_string_length;
    do {
      pCVar2 = (CX3DImporter_NodeElement *)p_Var4[1]._M_next;
      if (((pCVar2->Type == pType) && (__n = (pCVar2->ID)._M_string_length, __n == sVar1)) &&
         ((__n == 0 || (iVar3 = bcmp((pCVar2->ID)._M_dataplus._M_p,__s2,__n), iVar3 == 0)))) {
        if (pElement == (CX3DImporter_NodeElement **)0x0) {
          return bVar5;
        }
        *pElement = pCVar2;
        return bVar5;
      }
      p_Var4 = p_Var4->_M_next;
      bVar5 = p_Var4 != (_List_node_base *)&this->NodeElement_List;
    } while (bVar5);
  }
  return bVar5;
}

Assistant:

bool X3DImporter::FindNodeElement_FromRoot(const std::string& pID, const CX3DImporter_NodeElement::EType pType, CX3DImporter_NodeElement** pElement)
{
	for(std::list<CX3DImporter_NodeElement*>::iterator it = NodeElement_List.begin(); it != NodeElement_List.end(); ++it)
	{
		if(((*it)->Type == pType) && ((*it)->ID == pID))
		{
			if(pElement != nullptr) *pElement = *it;

			return true;
		}
	}// for(std::list<CX3DImporter_NodeElement*>::iterator it = NodeElement_List.begin(); it != NodeElement_List.end(); it++)

	return false;
}